

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_client_write(connectdata *conn,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  undefined1 *puVar2;
  Curl_easy *pCVar3;
  byte bVar4;
  CURLcode CVar5;
  short *psVar6;
  curl_write_callback p_Var7;
  size_t sVar8;
  short *psVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  curl_write_callback p_Var13;
  
  pCVar3 = conn->data;
  if (len == 0) {
    len = strlen(ptr);
  }
  if (((((type & 1U) != 0) && ((conn->handler->protocol & 0xc) != 0)) &&
      ((conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    bVar4 = (pCVar3->state).field_0x424;
    if ((bVar4 & 1) != 0) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar1 = &(pCVar3->state).crlf_conversions;
        *pcVar1 = *pcVar1 + 1;
        bVar4 = (pCVar3->state).field_0x424;
      }
      (pCVar3->state).field_0x424 = bVar4 & 0xfe;
    }
    psVar6 = (short *)memchr(ptr,0xd,len);
    if (psVar6 != (short *)0x0) {
      for (psVar9 = psVar6; psVar9 < ptr + (len - 1); psVar9 = (short *)((long)psVar9 + 1)) {
        if (*psVar9 == 0xa0d) {
          pcVar11 = (char *)((long)psVar9 + 1);
          psVar9 = (short *)((long)psVar9 + 1);
          *(char *)psVar6 = *pcVar11;
          pcVar1 = &(pCVar3->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        else if ((char)*psVar9 == '\r') {
          *(char *)psVar6 = '\n';
        }
        else {
          *(char *)psVar6 = (char)*psVar9;
        }
        psVar6 = (short *)((long)psVar6 + 1);
      }
      if (psVar9 < ptr + len) {
        if ((char)*psVar9 == '\r') {
          *(char *)psVar6 = '\n';
          puVar2 = &(pCVar3->state).field_0x424;
          *puVar2 = *puVar2 | 1;
        }
        else {
          *(char *)psVar6 = (char)*psVar9;
        }
        psVar6 = (short *)((long)psVar6 + 1);
      }
      if (psVar6 < ptr + len) {
        *(char *)psVar6 = '\0';
      }
      len = (long)psVar6 - (long)ptr;
    }
  }
  if (len == 0) {
    return CURLE_OK;
  }
  pCVar3 = conn->data;
  pcVar11 = ptr;
  sVar12 = len;
  if (((pCVar3->req).keepon & 0x10) != 0) goto LAB_001218e6;
  if ((type & 1U) == 0) {
    p_Var13 = (curl_write_callback)0x0;
  }
  else {
    p_Var13 = (pCVar3->set).fwrite_func;
  }
  if ((type & 2U) == 0) {
LAB_0012190a:
    p_Var7 = (curl_write_callback)0x0;
  }
  else {
    p_Var7 = (pCVar3->set).fwrite_header;
    if (p_Var7 == (curl_write_callback)0x0) {
      if ((pCVar3->set).writeheader == (void *)0x0) goto LAB_0012190a;
      p_Var7 = (pCVar3->set).fwrite_func;
    }
  }
  do {
    sVar10 = 0x4000;
    if (sVar12 < 0x4000) {
      sVar10 = sVar12;
    }
    if (p_Var13 != (curl_write_callback)0x0) {
      Curl_set_in_callback(pCVar3,true);
      sVar8 = (*p_Var13)(pcVar11,1,sVar10,(pCVar3->set).out);
      Curl_set_in_callback(pCVar3,false);
      if (sVar8 == 0x10000001) {
        if ((conn->handler->flags & 0x10) == 0) goto LAB_001218e6;
        pcVar11 = "Write callback asked for PAUSE when not supported!";
        goto LAB_00121a58;
      }
      if (sVar8 != sVar10) {
        Curl_failf(pCVar3,"Failed writing body (%zu != %zu)",sVar8,sVar10);
        return CURLE_WRITE_ERROR;
      }
    }
    sVar12 = sVar12 - sVar10;
    pcVar11 = pcVar11 + sVar10;
  } while (sVar12 != 0);
  if (p_Var7 == (curl_write_callback)0x0) {
    return CURLE_OK;
  }
  Curl_set_in_callback(pCVar3,true);
  sVar12 = (*p_Var7)(ptr,1,len,(pCVar3->set).writeheader);
  Curl_set_in_callback(pCVar3,false);
  if (sVar12 != 0x10000001) {
    if (sVar12 == len) {
      return CURLE_OK;
    }
    pcVar11 = "Failed writing header";
LAB_00121a58:
    Curl_failf(pCVar3,pcVar11);
    return CURLE_WRITE_ERROR;
  }
  type = 2;
  pcVar11 = ptr;
  sVar12 = len;
LAB_001218e6:
  CVar5 = pausewrite(pCVar3,type,pcVar11,sVar12);
  return CVar5;
}

Assistant:

CURLcode Curl_client_write(struct connectdata *conn,
                           int type,
                           char *ptr,
                           size_t len)
{
  struct Curl_easy *data = conn->data;

  if(0 == len)
    len = strlen(ptr);

  DEBUGASSERT(type <= 3);

  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
    (conn->handler->protocol & PROTO_FAMILY_FTP) &&
    conn->proto.ftpc.transfertype == 'A') {
    /* convert from the network encoding */
    CURLcode result = Curl_convert_from_network(data, ptr, len);
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

#ifdef CURL_DO_LINEEND_CONV
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
#endif /* CURL_DO_LINEEND_CONV */
    }

  return chop_write(conn, type, ptr, len);
}